

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.h
# Opt level: O2

void google::protobuf::internal::WireFormat::SerializeWithCachedSizes
               (Message *message,int size,CodedOutputStream *output)

{
  int iVar1;
  int v1;
  uint8_t *puVar2;
  Nullable<const_char_*> failure_msg;
  LogMessage LStack_28;
  
  iVar1 = io::CodedOutputStream::ByteCount(output);
  puVar2 = _InternalSerialize(message,output->cur_,&output->impl_);
  output->cur_ = puVar2;
  v1 = io::CodedOutputStream::ByteCount(output);
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                          (v1,size + iVar1,"output->ByteCount() == expected_endpoint");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.h"
             ,0x73,failure_msg);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&LStack_28,
             (char (*) [150])
             ": Protocol message serialized to a size different from what was originally expected.  Perhaps it was modified by another thread during serialization?"
            );
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

static void SerializeWithCachedSizes(const Message& message, int size,
                                       io::CodedOutputStream* output) {
    int expected_endpoint = output->ByteCount() + size;
    output->SetCur(
        _InternalSerialize(message, output->Cur(), output->EpsCopy()));
    ABSL_CHECK_EQ(output->ByteCount(), expected_endpoint)
        << ": Protocol message serialized to a size different from what was "
           "originally expected.  Perhaps it was modified by another thread "
           "during serialization?";
  }